

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

void __thiscall
icu_63::Transliterator::Transliterator
          (Transliterator *this,UnicodeString *theID,UnicodeFilter *adoptedFilter)

{
  UnicodeString *this_00;
  short sVar1;
  __off_t __length;
  int iVar2;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Transliterator_0045f480;
  this_00 = &this->ID;
  icu_63::UnicodeString::UnicodeString(this_00,theID);
  this->filter = adoptedFilter;
  this->maximumContextLength = 0;
  icu_63::UnicodeString::append(this_00,L'\0');
  sVar1 = (this->ID).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this->ID).fUnion.fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  icu_63::UnicodeString::truncate(this_00,(char *)(ulong)(iVar2 - 1),__length);
  return;
}

Assistant:

Transliterator::Transliterator(const UnicodeString& theID,
                               UnicodeFilter* adoptedFilter) :
    UObject(), ID(theID), filter(adoptedFilter),
    maximumContextLength(0)
{
    // NUL-terminate the ID string, which is a non-aliased copy.
    ID.append((UChar)0);
    ID.truncate(ID.length()-1);
}